

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall ki::dml::Field<unsigned_short>::~Field(Field<unsigned_short> *this)

{
  FieldBase::~FieldBase(&this->super_FieldBase);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Field() = default;